

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sections.cpp
# Opt level: O3

void ast::Sections::locate
               (Properties<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>
                *section_addresses)

{
  uint uVar1;
  Section *s;
  pointer pcVar2;
  bool bVar3;
  uint uVar4;
  iterator iVar5;
  long *plVar6;
  size_type *psVar7;
  ulong uVar8;
  _Rb_tree_color _Var9;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_e0;
  ulong local_c0;
  _Base_ptr local_b8;
  string local_b0;
  key_type local_90;
  string local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  if (DAT_0013da98 != table) {
    local_b8 = &(section_addresses->map)._M_t._M_impl.super__Rb_tree_header._M_header;
    _Var9 = _S_red;
    uVar8 = 0;
    do {
      s = *(Section **)(table + uVar8 * 8);
      pcVar2 = (s->name)._M_dataplus._M_p;
      local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_90,pcVar2,pcVar2 + (s->name)._M_string_length);
      iVar5 = std::
              _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
              ::find((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
                      *)section_addresses,&local_90);
      if (iVar5._M_node != local_b8) {
        _Var9 = iVar5._M_node[2]._M_color;
      }
      s->base_address = _Var9;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_90._M_dataplus._M_p != &local_90.field_2) {
        operator_delete(local_90._M_dataplus._M_p);
      }
      bVar3 = address_is_free(s);
      if (!bVar3) {
        std::operator+(&local_e0,"Section \"",&s->name);
        string_printf_abi_cxx11_
                  (&local_70,
                   "\" with size %d (0x%x) can\'t be located in address %d (0x%x), this overlap another section.\n"
                   ,(ulong)s->content_size,(ulong)s->content_size,(ulong)s->base_address,
                   (ulong)s->base_address);
        std::operator+(&local_50,&local_e0,&local_70);
        error_report(&local_50);
        std::__cxx11::string::~string((string *)&local_50);
        std::__cxx11::string::~string((string *)&local_70);
        std::__cxx11::string::~string((string *)&local_e0);
        exit(1);
      }
      uVar4 = s->base_address;
      uVar1 = s->content_size;
      if (uVar1 == 0) {
        local_c0 = (ulong)uVar4;
        std::operator+(&local_e0,"Section \"",&s->name);
        plVar6 = (long *)std::__cxx11::string::append((char *)&local_e0);
        psVar7 = (size_type *)(plVar6 + 2);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*plVar6 ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)psVar7) {
          local_b0.field_2._M_allocated_capacity = *psVar7;
          local_b0.field_2._8_8_ = plVar6[3];
          local_b0._M_dataplus._M_p = (pointer)&local_b0.field_2;
        }
        else {
          local_b0.field_2._M_allocated_capacity = *psVar7;
          local_b0._M_dataplus._M_p = (pointer)*plVar6;
        }
        local_b0._M_string_length = plVar6[1];
        *plVar6 = (long)psVar7;
        plVar6[1] = 0;
        *(undefined1 *)(plVar6 + 2) = 0;
        warning_report(&local_b0);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
          operator_delete(local_b0._M_dataplus._M_p);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_e0._M_dataplus._M_p != &local_e0.field_2) {
          operator_delete(local_e0._M_dataplus._M_p);
        }
        uVar4 = (uint)local_c0;
      }
      _Var9 = uVar1 + uVar4 + _S_black & ~_S_black;
      uVar8 = uVar8 + 1;
    } while (uVar8 < (ulong)(DAT_0013da98 - table >> 3));
  }
  return;
}

Assistant:

void Sections::locate(Properties<string, unsigned> *section_addresses)
{
	auto current_address = 0;
	for (size_t i = 0; i < table.size(); ++i) {
		Section *section = table[i];
		section->base_address = section_addresses->get_property(section->name, current_address);
		if ( !address_is_free(section)) {
			error_report("Section \"" + section->name
						 + string_printf("\" with size %d (0x%x) can't be located in address %d (0x%x)"
									 ", this overlap another section.\n",
									 section->content_size, section->content_size,
									 section->base_address, section->base_address));
			exit(EXIT_FAILURE);
		}
		// alinhar o início da secção em endereço par
		current_address = align(section->base_address + section->content_size, 1);
		if (section->content_size == 0)
			warning_report("Section \"" + section->name + "\" is empty");
	}
}